

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpack.c
# Opt level: O2

int fp_get_param(int argc,char **argv,fpstate *fpptr)

{
  char cVar1;
  ushort *puVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  ushort **ppuVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  int iVar15;
  double dVar16;
  long local_468;
  int local_454;
  char tile [513];
  char tmp [513];
  
  if (fpptr->initialized == 0x2a) {
    tile[0] = '\0';
    bVar5 = false;
    local_454 = 0;
    bVar3 = false;
    bVar6 = false;
    bVar7 = false;
    for (iVar15 = 1; iVar15 < argc; iVar15 = iVar15 + 1) {
      pcVar14 = argv[iVar15];
      if (((*pcVar14 != '-') ||
          (((((sVar10 = strlen(pcVar14), sVar10 != 2 && (pcVar14[1] != 'q')) &&
             ((pcVar14[1] != 'q' || (pcVar14[2] != 'z')))) &&
            ((pcVar14[1] != 'g' || (pcVar14[2] != '1')))) &&
           ((pcVar14[1] != 'g' || (pcVar14[2] != '2')))))) &&
         ((((iVar8 = strncmp(pcVar14,"-i2f",4), iVar8 != 0 &&
            (iVar8 = strncmp(pcVar14,"-n3ratio",8), iVar8 != 0)) &&
           (iVar8 = strncmp(pcVar14,"-n3min",6), iVar8 != 0)) &&
          ((iVar8 = strncmp(pcVar14,"-tableonly",10), iVar8 != 0 &&
           (iVar8 = strncmp(pcVar14,"-table",6), iVar8 != 0)))))) break;
      cVar1 = pcVar14[1];
      if (cVar1 == 'd') {
        fpptr->comptype = -1;
LAB_001039cf:
        bVar4 = !bVar3;
        bVar3 = true;
        if (bVar4) goto LAB_001039dc;
        pcVar14 = "Error: multiple compression flags\n";
        goto LAB_00103ed4;
      }
      if (cVar1 == 'g') {
        fpptr->comptype = (pcVar14[2] == '2') + 0x15;
        goto LAB_001039cf;
      }
      if (cVar1 == 'h') {
        fpptr->comptype = 0x29;
        goto LAB_001039cf;
      }
      if (cVar1 == 'p') {
        fpptr->comptype = 0x1f;
        goto LAB_001039cf;
      }
      if (cVar1 == 'r') {
        fpptr->comptype = 0xb;
        goto LAB_001039cf;
      }
      iVar8 = strcmp(pcVar14,"-i2f");
      if (iVar8 == 0) {
        fpptr->int_to_float = 1;
        goto LAB_001039dc;
      }
      iVar8 = strcmp(pcVar14,"-n3ratio");
      if (iVar8 == 0) {
        iVar15 = iVar15 + 1;
        if (iVar15 < argc) {
          dVar16 = atof(argv[iVar15]);
          fpptr->n3ratio = (float)dVar16;
          goto LAB_001039dc;
        }
        goto LAB_00103ed9;
      }
      iVar8 = strcmp(pcVar14,"-n3min");
      if (iVar8 == 0) {
        iVar15 = iVar15 + 1;
        if (iVar15 < argc) {
          dVar16 = atof(argv[iVar15]);
          fpptr->n3min = (float)dVar16;
          goto LAB_001039dc;
        }
        goto LAB_00103ed9;
      }
      if (cVar1 == 'n') {
        iVar15 = iVar15 + 1;
        if (iVar15 < argc) {
          dVar16 = atof(argv[iVar15]);
          fpptr->rescale_noise = (float)dVar16;
          goto LAB_001039dc;
        }
        goto LAB_00103ed9;
      }
      if (cVar1 == 's') {
        iVar15 = iVar15 + 1;
        if (iVar15 < argc) {
          dVar16 = atof(argv[iVar15]);
          fpptr->scale = (float)dVar16;
          goto LAB_001039dc;
        }
        goto LAB_00103ed9;
      }
      if (cVar1 == 'q') {
        cVar1 = pcVar14[2];
        if (cVar1 == 't') {
LAB_001039c3:
          fpptr->dither_offset = -1;
        }
        else if (cVar1 == 'z') {
          fpptr->dither_method = 2;
          cVar1 = pcVar14[3];
          if ((long)cVar1 == 0x74) goto LAB_001039c3;
          ppuVar11 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar11 + (long)cVar1 * 2 + 1) & 8) != 0) {
            pcVar14 = pcVar14 + 3;
            goto LAB_00103b7c;
          }
        }
        else {
          ppuVar11 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar11 + (long)cVar1 * 2 + 1) & 8) != 0) {
            pcVar14 = pcVar14 + 2;
LAB_00103b7c:
            uVar9 = atoi(pcVar14);
            if (uVar9 == 0) {
              fpptr->no_dither = 1;
            }
            else {
              if (10000 < uVar9) {
                pcVar14 = "Error: invalid q suffix\n";
                goto LAB_00103ed4;
              }
              fpptr->dither_offset = uVar9;
            }
          }
        }
        iVar15 = iVar15 + 1;
        if (iVar15 < argc) {
          dVar16 = atof(argv[iVar15]);
          fpptr->quantize_level = (float)dVar16;
          goto LAB_001039dc;
        }
        goto LAB_00103ed9;
      }
      iVar8 = strcmp(pcVar14,"-tableonly");
      if (iVar8 == 0) {
        fpptr->do_images = 0;
        fpptr->do_tables = 1;
LAB_00103ce5:
        fwrite("Note: The table compression method used by fpack has been\n",0x3a,1,_stderr);
        fwrite(" officially approved as part of FITS format standard since 2016.\n",0x41,1,_stderr);
        fwrite(" However users should be aware that the compressed table files may\n",0x43,1,_stderr
              );
        fwrite(" only be readable by a limited number of applications (including fpack).\n",0x49,1,
               _stderr);
        goto LAB_001039dc;
      }
      iVar8 = strcmp(pcVar14,"-table");
      if (iVar8 == 0) {
        fpptr->do_tables = 1;
        goto LAB_00103ce5;
      }
      switch(cVar1) {
      case 'C':
        fpptr->do_checksums = 0;
        break;
      case 'D':
        fpptr->delete_input = fpptr->delete_input + 1;
        break;
      case 'E':
      case 'G':
      case 'I':
      case 'J':
      case 'K':
      case 'M':
      case 'N':
      case 'P':
      case 'Q':
      case 'U':
      case 'W':
      case 'X':
switchD_00103ae0_caseD_45:
        fp_msg("Error: unknown command line flag `");
        fp_msg(argv[iVar15]);
        fp_msg("\'\n");
LAB_00103f77:
        fp_usage();
        fp_hint();
        goto LAB_00103ef8;
      case 'F':
        fpptr->clobber = fpptr->clobber + 1;
        break;
      case 'H':
        fp_help();
        goto LAB_00103faa;
      case 'L':
        fpptr->listonly = fpptr->listonly + 1;
        break;
      case 'O':
        if (bVar6) {
          pcVar14 = "Error: -O option is not allowed with -R\n";
          goto LAB_00103ef3;
        }
        iVar15 = iVar15 + 1;
        if (argc <= iVar15) goto LAB_00103f77;
        strncpy(fpptr->outfile,argv[iVar15],0x200);
        fpptr->outfile[0x200] = '\0';
        bVar6 = false;
        bVar7 = true;
        break;
      case 'R':
        if (bVar7) {
          pcVar14 = "Error: -R option is not allowed with -O\n";
          goto LAB_00103ef3;
        }
        iVar15 = iVar15 + 1;
        if (argc <= iVar15) goto LAB_00103f77;
        strncpy(fpptr->outfile,argv[iVar15],0x200);
        fpptr->outfile[0x200] = '\0';
        bVar7 = false;
        bVar6 = true;
        break;
      case 'S':
        fpptr->to_stdout = fpptr->to_stdout + 1;
        break;
      case 'T':
        fpptr->test_all = 1;
        break;
      case 'V':
        fp_version();
LAB_00103faa:
        exit(0);
      case 'Y':
        fpptr->do_not_prompt = fpptr->do_not_prompt + 1;
        break;
      default:
        if (cVar1 == 'w') {
          if (bVar5) {
LAB_00103f3f:
            pcVar14 = "Error: multiple tile specifications\n";
            goto LAB_00103ed4;
          }
          local_454 = local_454 + 1;
        }
        else {
          if (cVar1 == 'v') {
            fpptr->verbose = 1;
            break;
          }
          if (cVar1 != 't') goto switchD_00103ae0_caseD_45;
          if (bVar5) goto LAB_00103f3f;
          iVar15 = iVar15 + 1;
          if (argc <= iVar15) goto LAB_00103ed9;
          strncpy(tile,argv[iVar15],0x200);
          tile[0x200] = '\0';
        }
        bVar5 = true;
      }
LAB_001039dc:
    }
    if ((bVar6) && (fpptr->test_all == 0)) {
      pcVar14 = "Error: -R option may only be used with -T\n";
    }
    else if ((bVar7) && ((fpptr->test_all != 0 || (fpptr->to_stdout != 0)))) {
      pcVar14 = "Error: -O option may not be used with -S or -T\n";
    }
    else if (((fpptr->scale == 0.0) && (!NAN(fpptr->scale))) ||
            ((fpptr->comptype == 0x29 || (fpptr->test_all == 1)))) {
      if ((fpptr->quantize_level != 0.0) || (NAN(fpptr->quantize_level))) {
LAB_00103dc0:
        if (local_454 == 0) {
          if (bVar5) {
            sVar10 = strlen(tile);
            local_468 = 0;
            lVar12 = 0;
            do {
              lVar13 = (long)(int)lVar12;
              lVar12 = lVar13 + -1;
              while( true ) {
                if ((int)sVar10 <= lVar13) goto LAB_00103eab;
                ppuVar11 = __ctype_b_loc();
                puVar2 = *ppuVar11;
                cVar1 = tile[lVar13];
                if (((long)cVar1 != 0x2c) && ((puVar2[cVar1] & 0x800) == 0)) {
                  fp_msg("Error: `-t\' requires comma separated tile dims, ");
                  pcVar14 = "e.g., `-t 100,100\'\n";
                  goto LAB_00103ef3;
                }
                if (cVar1 != ',') break;
                lVar13 = lVar13 + 1;
                lVar12 = lVar12 + 1;
              }
              lVar13 = atol(tile + lVar13);
              fpptr->ntile[local_468] = lVar13;
              do {
                lVar13 = lVar12 + 1;
                lVar12 = lVar12 + 1;
              } while ((*(byte *)((long)puVar2 + (long)tile[lVar13] * 2 + 1) & 8) != 0);
              local_468 = local_468 + 1;
            } while (local_468 != 7);
            fp_msg("Error: too many dimensions for `-t\', max=");
            pcVar14 = tmp;
            snprintf(pcVar14,0x201,"%d\n",6);
            goto LAB_00103ef3;
          }
        }
        else {
          for (lVar12 = 0; lVar12 != 6; lVar12 = lVar12 + 1) {
            fpptr->ntile[lVar12] = -1;
          }
        }
LAB_00103eab:
        if (iVar15 < argc) {
          fpptr->firstfile = iVar15;
          return 0;
        }
        pcVar14 = "Error: no FITS files to compress\n";
LAB_00103ed4:
        fp_msg(pcVar14);
LAB_00103ed9:
        fp_usage();
        goto LAB_00103ef8;
      }
      if (fpptr->comptype - 0x15U < 2) {
        if (fpptr->int_to_float != 1) goto LAB_00103dc0;
        pcVar14 = "Error: `-q 0\' not allowed with -i2f\n";
      }
      else {
        pcVar14 = "Error: `-q 0\' only allowed with GZIP\n";
      }
    }
    else {
      pcVar14 = "Error: `-s\' requires `-h or -T\'\n";
    }
  }
  else {
    pcVar14 = "Error: internal initialization error\n";
  }
LAB_00103ef3:
  fp_msg(pcVar14);
LAB_00103ef8:
  exit(-1);
}

Assistant:

int fp_get_param (int argc, char *argv[], fpstate *fpptr)
{
	int	gottype=0, gottile=0, wholetile=0, iarg, len, ndim, ii, doffset;
        int     gotR=0, gotO=0;
	char	tmp[SZ_STR], tile[SZ_STR];

        if (fpptr->initialized != FP_INIT_MAGIC) {
            fp_msg ("Error: internal initialization error\n"); exit (-1);
        }

	tile[0] = 0;

	/* flags must come first and be separately specified
	 */
	for (iarg = 1; iarg < argc; iarg++) {
	    if ((argv[iarg][0] == '-' && strlen (argv[iarg]) == 2) ||
	        !strncmp(argv[iarg], "-q", 2) || !strncmp(argv[iarg], "-qz", 3) ||
	        !strncmp(argv[iarg], "-g1", 3) || !strncmp(argv[iarg], "-g2", 3) ||
	        !strncmp(argv[iarg], "-i2f", 4) ||
	        !strncmp(argv[iarg], "-n3ratio", 8) || !strncmp(argv[iarg], "-n3min", 6) ||
	        !strncmp(argv[iarg], "-tableonly", 10) || !strncmp(argv[iarg], "-table", 6) )  
	    {

		/* Rice is the default, so -r is superfluous  */
		if (       argv[iarg][1] == 'r') {
		    fpptr->comptype = RICE_1;
		    if (gottype) {
			fp_msg ("Error: multiple compression flags\n");
			fp_usage (); exit (-1);
		    } else
			gottype++;

		} else if (argv[iarg][1] == 'p') {
		    fpptr->comptype = PLIO_1;
		    if (gottype) {
			fp_msg ("Error: multiple compression flags\n");
			fp_usage (); exit (-1);
		    } else
			gottype++;

		} else if (argv[iarg][1] == 'g') {
		    /* test for modifiers following the 'g' */
                    if (argv[iarg][2] == '2')
		        fpptr->comptype = GZIP_2;
		    else
		        fpptr->comptype = GZIP_1;

		    if (gottype) {
			fp_msg ("Error: multiple compression flags\n");
			fp_usage (); exit (-1);
		    } else
			gottype++;
/*
		} else if (argv[iarg][1] == 'b') {
		    fpptr->comptype = BZIP2_1;
		    if (gottype) {
			fp_msg ("Error: multiple compression flags\n");
			fp_usage (); exit (-1);
		    } else
			gottype++;
*/
		} else if (argv[iarg][1] == 'h') {
		    fpptr->comptype = HCOMPRESS_1;
		    if (gottype) {
			fp_msg ("Error: multiple compression flags\n");
			fp_usage (); exit (-1);
		    } else
			gottype++;

		} else if (argv[iarg][1] == 'd') {
		    fpptr->comptype = NOCOMPRESS;
		    if (gottype) {
			fp_msg ("Error: multiple compression flags\n");
			fp_usage (); exit (-1);
		    } else
			gottype++;

		} else if (!strcmp(argv[iarg], "-i2f")) {
		    /* this means convert integer images to float, and then */
		    /* quantize and compress the float image.  This lossy */
		    /* compression method may give higher compression than the */
		    /* lossless compression method that is usually applied to */
		    /* integer images. */
		    
		    fpptr->int_to_float = 1;

		} else if (!strcmp(argv[iarg], "-n3ratio")) {
		    /* this is the minimum ratio between the MAD noise sigma */
		    /* and the q parameter value in the case where the integer */
		    /* image is quantized and compressed like a float image. */
		    if (++iarg >= argc) {
			fp_usage (); exit (-1);
		    } else {
			fpptr->n3ratio = (float) atof (argv[iarg]);
		    }
		} else if (!strcmp(argv[iarg], "-n3min")) {
		    /* this is the minimum  MAD noise sigma in the case where the */
		    /* integer image is quantized and compressed like a float image. */
		    if (++iarg >= argc) {
			fp_usage (); exit (-1);
		    } else {
			fpptr->n3min = (float) atof (argv[iarg]);
		    }
		} else if (argv[iarg][1] == 'q') {
		    /* test for modifiers following the 'q' */

                    if (argv[iarg][2] == 'z') {
		        fpptr->dither_method = 2;  /* preserve zero pixels */

                        if (argv[iarg][3] == 't') {
		            fpptr->dither_offset = -1;  /* dither based on tile checksum */

                        } else if (isdigit(argv[iarg][3])) { /* is a number appended to q? */
		           doffset = atoi(argv[iarg]+3);

                           if (doffset == 0) {
		              fpptr->no_dither = 1;  /* don't dither the quantized values */
		           } else if (doffset > 0 && doffset <= 10000) {
		              fpptr->dither_offset = doffset;
		           } else {
			      fp_msg ("Error: invalid q suffix\n");
			      fp_usage (); exit (-1);
		           }
			}
		    } else {
                        if (argv[iarg][2] == 't') {
		            fpptr->dither_offset = -1;  /* dither based on tile checksum */

                        } else if (isdigit(argv[iarg][2])) { /* is a number appended to q? */
		           doffset = atoi(argv[iarg]+2);

                           if (doffset == 0) {
		              fpptr->no_dither = 1;  /* don't dither the quantized values */
		           } else if (doffset > 0 && doffset <= 10000) {
		              fpptr->dither_offset = doffset;
		           } else {
			      fp_msg ("Error: invalid q suffix\n");
			      fp_usage (); exit (-1);
		           }
			}
		    }

		    if (++iarg >= argc) {
			fp_usage (); exit (-1);
		    } else {
			fpptr->quantize_level = (float) atof (argv[iarg]);
		    }
		} else if (argv[iarg][1] == 'n') {
		    if (++iarg >= argc) {
			fp_usage (); exit (-1);
		    } else {
			fpptr->rescale_noise = (float) atof (argv[iarg]);
		    }
		} else if (argv[iarg][1] == 's') {
		    if (++iarg >= argc) {
			fp_usage (); exit (-1);
		    } else {
			fpptr->scale = (float) atof (argv[iarg]);
		    }
		} else if (!strcmp(argv[iarg], "-tableonly")) {
		    fpptr->do_tables = 1;
		    fpptr->do_images = 0;
                    /* Do not write this to stdout via fp_msg.  Otherwise it will be placed at start of piped FITS
                       file, which will then be corrupted. */
                    fprintf(stderr, "Note: The table compression method used by fpack has been\n");
		    fprintf(stderr, " officially approved as part of FITS format standard since 2016.\n");
		    fprintf(stderr, " However users should be aware that the compressed table files may\n");
		    fprintf(stderr, " only be readable by a limited number of applications (including fpack).\n");

		} else if (!strcmp(argv[iarg], "-table")) {
		    fpptr->do_tables = 1;
                    fprintf(stderr, "Note: The table compression method used by fpack has been\n");
		    fprintf(stderr, " officially approved as part of FITS format standard since 2016.\n");
		    fprintf(stderr, " However users should be aware that the compressed table files may\n");
		    fprintf(stderr, " only be readable by a limited number of applications (including fpack).\n");

		} else if (argv[iarg][1] == 't') {
		    if (gottile) {
			fp_msg ("Error: multiple tile specifications\n");
			fp_usage (); exit (-1);
		    } else
			gottile++;

		    if (++iarg >= argc) {
			fp_usage (); exit (-1);
		    } else {
			strncpy (tile, argv[iarg], SZ_STR-1); /* checked below */
                        tile[SZ_STR-1]=0;
                    }

		} else if (argv[iarg][1] == 'v') {
		    fpptr->verbose = 1;

		} else if (argv[iarg][1] == 'w') {
		    wholetile++;
		    if (gottile) {
			fp_msg ("Error: multiple tile specifications\n");
			fp_usage (); exit (-1);
		    } else
			gottile++;

		} else if (argv[iarg][1] == 'F') {
		    fpptr->clobber++;       /* overwrite existing file */

		} else if (argv[iarg][1] == 'D') {
		    fpptr->delete_input++;

		} else if (argv[iarg][1] == 'Y') {
		    fpptr->do_not_prompt++;

		} else if (argv[iarg][1] == 'S') {
		    fpptr->to_stdout++;

		} else if (argv[iarg][1] == 'L') {
		    fpptr->listonly++;

		} else if (argv[iarg][1] == 'C') {
		    fpptr->do_checksums = 0;

		} else if (argv[iarg][1] == 'T') {
		    fpptr->test_all = 1;

		} else if (argv[iarg][1] == 'R') {
                    if (gotO) {
                        fp_msg("Error: -R option is not allowed with -O\n");
                        exit(-1);
		    } else if (++iarg >= argc) {
			fp_usage (); fp_hint (); exit (-1);
		    } else {
			strncpy (fpptr->outfile, argv[iarg], SZ_STR-1);
                        fpptr->outfile[SZ_STR-1]=0;
                        gotR=1;
                    }

		} else if (argv[iarg][1] == 'H') {
		    fp_help (); exit (0);

		} else if (argv[iarg][1] == 'V') {
		    fp_version (); exit (0);
                    
                } else if (argv[iarg][1] == 'O') {
                    if (gotR) {
                        fp_msg("Error: -O option is not allowed with -R\n");
                        exit(-1);
		    } else if (++iarg >= argc) {
			fp_usage (); fp_hint (); exit (-1);
		    } else {
			strncpy (fpptr->outfile, argv[iarg], SZ_STR-1);
                        fpptr->outfile[SZ_STR-1]=0;
                        gotO=1;
                    }
                
		} else {
		    fp_msg ("Error: unknown command line flag `");
		    fp_msg (argv[iarg]); fp_msg ("'\n");
		    fp_usage (); fp_hint (); exit (-1);
		}

	    } else
		break;
	}

        /* In earlier loop, already made sure both -O and -R are not being used.
           This is essential, as each must store info in the same 'outfile' array. 
           Now do additional tests of -O and -R with other flags. */
        
        if (gotR && !fpptr->test_all) {
            fp_msg("Error: -R option may only be used with -T\n"); exit(-1);
        }
        
        if (gotO && (fpptr->test_all || fpptr->to_stdout)) {
            fp_msg("Error: -O option may not be used with -S or -T\n"); exit(-1);
        }
        
	if (fpptr->scale != 0. && 
	         fpptr->comptype != HCOMPRESS_1 && fpptr->test_all != 1) {

	    fp_msg ("Error: `-s' requires `-h or -T'\n"); exit (-1);
	}

	if (fpptr->quantize_level == 0) {
	
	    if ((fpptr->comptype != GZIP_1) && (fpptr->comptype != GZIP_2)) {
	        fp_msg ("Error: `-q 0' only allowed with GZIP\n"); exit (-1);
	    }

            if (fpptr->int_to_float == 1) {
	        fp_msg ("Error: `-q 0' not allowed with -i2f\n"); exit (-1);
	    }
	}

	if (wholetile) {
	    for (ndim=0; ndim < MAX_COMPRESS_DIM; ndim++)
		fpptr->ntile[ndim] = (long) -1;

	} else if (gottile) {
	    len = strlen (tile);
	    for (ii=0, ndim=0; ii < len; ) {
		if (! (isdigit (tile[ii]) || tile[ii] == ',')) {
		    fp_msg ("Error: `-t' requires comma separated tile dims, ");
		    fp_msg ("e.g., `-t 100,100'\n"); exit (-1);
		}

		if (tile[ii] == ',') { ii++; continue; }

		fpptr->ntile[ndim] = atol (&tile[ii]);
		for ( ; isdigit(tile[ii]); ii++);

		if (++ndim > MAX_COMPRESS_DIM) {
		    fp_msg ("Error: too many dimensions for `-t', max=");
		    snprintf (tmp, SZ_STR,"%d\n", MAX_COMPRESS_DIM); fp_msg (tmp);
		    exit (-1);
		}
	    }
	}

	if (iarg >= argc) {
	    fp_msg ("Error: no FITS files to compress\n");
	    fp_usage (); exit (-1);
	} else
	    fpptr->firstfile = iarg;

	return(0);
}